

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhStoreCell(lhpage *pPage,void *pKey,sxu32 nKeyLen,void *pData,unqlite_int64 nDataLen,
               sxu32 nHash,int auto_append)

{
  lhash_kv_engine *pEngine;
  void *pData_00;
  sxu64 nDatalen;
  int iVar1;
  int iVar2;
  lhcell *pCell;
  sxu32 nKeyLen_00;
  uint nSize;
  sxu16 nOfft;
  sxu32 local_54;
  void *local_50;
  ulong local_48;
  sxu64 local_40;
  lhpage *pSlave;
  
  pEngine = pPage->pHash;
  local_54 = nHash;
  local_40 = nDataLen;
  iVar1 = (*pEngine->pIo->xWrite)(pPage->pRaw);
  nDatalen = local_40;
  if (iVar1 == 0) {
    local_50 = pData;
    local_48 = (ulong)nKeyLen;
    iVar1 = lhAllocateSpace(pPage,(nKeyLen + 0x1a) + local_40,&nOfft);
    if ((iVar1 == 0) || (iVar2 = lhAllocateSpace(pPage,0x1a,&nOfft), iVar2 == 0)) {
      pCell = lhNewCell(pEngine,pPage);
      pData_00 = local_50;
      if (pCell == (lhcell *)0x0) {
        (*pEngine->pIo->xErr)(pEngine->pIo->pHandle,"KV store is running out of memory");
      }
      else {
        pCell->iStart = nOfft;
        nSize = (uint)local_48;
        pCell->nKey = nSize;
        pCell->nData = nDatalen;
        pCell->nHash = local_54;
        if (nSize < 0x40000) {
          SyBlobAppend(&pCell->sKey,pKey,nSize);
        }
        iVar2 = lhInstallCell(pCell);
        if (iVar2 == 0) {
          if (iVar1 == 0) {
            lhCellWriteLocalPayload(pCell,pKey,nSize,pData_00,nDatalen);
          }
          else {
            iVar1 = lhCellWriteOvflPayload(pCell,pKey,nSize,pData_00,nDatalen,0);
            if (iVar1 != 0) {
              lhCellDiscard(pCell);
              return iVar1;
            }
          }
          lhCellWriteHeader(pCell);
          return 0;
        }
      }
      iVar1 = -1;
    }
    else if (auto_append == 0) {
      iVar1 = -0x49;
    }
    else {
      nKeyLen_00 = (sxu32)local_48;
      iVar1 = lhFindSlavePage(pPage,(local_48 & 0xffffffff) + nDatalen,(sxu16 *)0x0,&pSlave);
      if (iVar1 == 0) {
        iVar1 = lhStoreCell(pSlave,pKey,nKeyLen_00,local_50,nDatalen,local_54,1);
      }
    }
  }
  return iVar1;
}

Assistant:

static int lhStoreCell(
	lhpage *pPage, /* Target page */
	const void *pKey,sxu32 nKeyLen, /* Payload: Key */
	const void *pData,unqlite_int64 nDataLen, /* Payload: Data */
	sxu32 nHash, /* Hash of the key */
	int auto_append /* Auto append a slave page if full */
	)
{
	lhash_kv_engine *pEngine = pPage->pHash;
	int iNeedOvfl = 0; /* Need overflow page for this cell and its payload*/
	lhcell *pCell;
	sxu16 nOfft;
	int rc;
	/* Acquire a writer lock on this page first */
	rc = pEngine->pIo->xWrite(pPage->pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Check for a free block  */
	rc = lhAllocateSpace(pPage,L_HASH_CELL_SZ+nKeyLen+nDataLen,&nOfft);
	if( rc != UNQLITE_OK ){
		/* Check for a free block to hold a single cell only (without payload) */
		rc = lhAllocateSpace(pPage,L_HASH_CELL_SZ,&nOfft);
		if( rc != UNQLITE_OK ){
			if( !auto_append ){
				/* A split must be done */
				return UNQLITE_FULL;
			}else{
				/* Store this record in a slave page */
				rc = lhSlaveStore(pPage,pKey,nKeyLen,pData,nDataLen,nHash);
				return rc;
			}
		}
		iNeedOvfl = 1;
	}
	/* Allocate a new cell instance */
	pCell = lhNewCell(pEngine,pPage);
	if( pCell == 0 ){
		pEngine->pIo->xErr(pEngine->pIo->pHandle,"KV store is running out of memory");
		return UNQLITE_NOMEM;
	}
	/* Fill-in the structure */
	pCell->iStart = nOfft;
	pCell->nKey = nKeyLen;
	pCell->nData = (sxu64)nDataLen;
	pCell->nHash = nHash;
	if( nKeyLen < 262144 /* 256 KB */ ){
		/* Keep the key in-memory for fast lookup */
		SyBlobAppend(&pCell->sKey,pKey,nKeyLen);
	}
	/* Link the cell */
	rc = lhInstallCell(pCell);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Write the payload */
	if( iNeedOvfl ){
		rc = lhCellWriteOvflPayload(pCell,pKey,nKeyLen,pData,nDataLen,(const void *)0);
		if( rc != UNQLITE_OK ){
			lhCellDiscard(pCell);
			return rc;
		}
	}else{
		lhCellWriteLocalPayload(pCell,pKey,nKeyLen,pData,nDataLen);
	}
	/* Finally, Write the cell header */
	lhCellWriteHeader(pCell);
	/* All done */
	return UNQLITE_OK;
}